

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QStringList * __thiscall
MakefileGenerator::fileFixify
          (QStringList *__return_storage_ptr__,MakefileGenerator *this,QStringList *files,
          FileFixifyTypes fix,bool canon)

{
  long lVar1;
  QString *pQVar2;
  QString *file;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (files->d).size;
  if (lVar1 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QArrayDataPointer<QString>::QArrayDataPointer(&__return_storage_ptr__->d,&files->d);
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
    pQVar2 = (files->d).ptr;
    for (file = pQVar2; file != pQVar2 + lVar1; file = file + 1) {
      if ((file->d).size != 0) {
        fileFixify((QString *)&local_50,this,file,fix,canon);
        QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        pQVar2 = (files->d).ptr;
        lVar1 = (files->d).size;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QStringList
MakefileGenerator::fileFixify(const QStringList &files, FileFixifyTypes fix, bool canon) const
{
    if(files.isEmpty())
        return files;
    QStringList ret;
    for(QStringList::ConstIterator it = files.begin(); it != files.end(); ++it) {
        if(!(*it).isEmpty())
            ret << fileFixify((*it), fix, canon);
    }
    return ret;
}